

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

bool __thiscall IntElemBoundsImp<0,_0,_0>::propagate(IntElemBoundsImp<0,_0,_0> *this)

{
  long lVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  IntView<0> *pIVar5;
  IntVar *pIVar6;
  IntVar *pIVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  Reason RVar11;
  Clause *pCVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  Lit p;
  IntView<0> *pIVar18;
  anon_union_8_2_743a5d44_for_Reason_0 aVar19;
  bool bVar20;
  anon_union_8_2_743a5d44_for_Reason_0 aVar21;
  ulong uVar22;
  int64_t m_v;
  bool bVar23;
  byte bVar24;
  initializer_list<Lit> __l;
  initializer_list<Lit> __l_00;
  initializer_list<Lit> __l_01;
  initializer_list<Lit> __l_02;
  initializer_list<Lit> __l_03;
  initializer_list<Lit> __l_04;
  initializer_list<Lit> __l_05;
  initializer_list<Lit> __l_06;
  Clause *c;
  vector<Lit,_std::allocator<Lit>_> expl;
  allocator_type local_131;
  anon_union_8_2_743a5d44_for_Reason_0 local_130;
  vector<Lit,_std::allocator<Lit>_> local_128;
  vector<Lit,_std::allocator<Lit>_> local_108;
  vector<Lit,_std::allocator<Lit>_> local_f0;
  vector<Lit,_std::allocator<Lit>_> local_d8;
  vector<Lit,_std::allocator<Lit>_> local_c0;
  vector<Lit,_std::allocator<Lit>_> local_a8;
  vector<Lit,_std::allocator<Lit>_> local_90;
  vector<Lit,_std::allocator<Lit>_> local_78;
  vector<Lit,_std::allocator<Lit>_> local_60;
  vector<Lit,_std::allocator<Lit>_> local_48;
  
  uVar17 = (this->b).v;
  cVar2 = sat.assigns.data[uVar17];
  if ((cVar2 == 0) || ((uint)(this->b).s * 2 + -1 != (int)cVar2)) {
    cVar3 = (this->is_fixed).v;
    if (cVar3 != '\0') {
      iVar10 = (this->fixed_index).v;
      if ((iVar10 < 0) || ((int)(this->a).sz <= iVar10)) {
        iVar10 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
        aVar21._pt = (Clause *)((long)iVar10 * 4 + 2);
        p.x = ((this->b).s ^ 1) + (this->b).v * 2;
LAB_001a5ceb:
        SAT::cEnqueue(&sat,p,(Reason)aVar21);
        bVar24 = sat.confl == (Clause *)0x0;
        goto LAB_001a66cf;
      }
      if (cVar3 == '\0') goto LAB_001a5957;
      uVar4 = (this->fixed_index).v;
      pIVar5 = (this->a).data;
      pIVar18 = pIVar5 + uVar4;
      pIVar6 = pIVar5[uVar4].var;
      iVar10 = (pIVar6->min).v;
      if (cVar2 == '\0') {
        pIVar7 = (this->y).var;
        if ((pIVar7->max).v < iVar10) {
          iVar10 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar10);
          iVar10 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[8])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(iVar10,local_128.
                                              super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                              super__Vector_impl_data._M_start._0_4_);
          iVar10 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar10);
          __l_02._M_len = 3;
          __l_02._M_array = (iterator)&local_128;
          std::vector<Lit,_std::allocator<Lit>_>::vector(&local_a8,__l_02,&local_131);
          iVar10 = (int)((ulong)((long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2) + 1;
          local_130._pt = (Clause *)malloc((long)iVar10 * 4 + 8);
          *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar10 * 0x100 + 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
          if ((long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar13 = (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar14 = 1;
            do {
              if (*(uint *)local_130._pt >> 8 <= uVar14) goto LAB_001a68e7;
              (local_130._pt)->data[uVar14].x =
                   local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14 - 1].x;
              lVar16 = (-(ulong)(lVar13 == 0) - lVar13) + uVar14;
              uVar14 = uVar14 + 1;
            } while (lVar16 != 0);
          }
        }
        else {
          bVar24 = 1;
          if ((pIVar7->min).v <= (pIVar6->max).v) goto LAB_001a66cf;
          iVar10 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,iVar10);
          iVar10 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[9])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(iVar10,local_128.
                                              super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                              super__Vector_impl_data._M_start._0_4_);
          iVar10 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar10);
          __l_03._M_len = 3;
          __l_03._M_array = (iterator)&local_128;
          std::vector<Lit,_std::allocator<Lit>_>::vector(&local_c0,__l_03,&local_131);
          iVar10 = (int)((ulong)((long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                      .super__Vector_impl_data._M_start) >> 2) + 1;
          local_130._pt = (Clause *)malloc((long)iVar10 * 4 + 8);
          *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar10 * 0x100 + 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
          local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if ((long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar13 = (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar14 = 1;
            do {
              if (*(uint *)local_130._pt >> 8 <= uVar14) goto LAB_001a68e7;
              (local_130._pt)->data[uVar14].x =
                   local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14 - 1].x;
              lVar16 = (-(ulong)(lVar13 == 0) - lVar13) + uVar14;
              uVar14 = uVar14 + 1;
            } while (lVar16 != 0);
          }
        }
        aVar21 = local_130;
        if (local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        p.x = ((this->b).s ^ 1) + (this->b).v * 2;
        goto LAB_001a5ceb;
      }
      if ((((this->y).var)->min).v < iVar10) {
        if (so.lazy) {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                       uVar17 * 2);
          iVar9 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[8])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(iVar9,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_);
          iVar9 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar9);
          __l._M_len = 3;
          __l._M_array = (iterator)&local_128;
          std::vector<Lit,_std::allocator<Lit>_>::vector(&local_48,__l,&local_131);
          iVar9 = (int)((ulong)((long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                      .super__Vector_impl_data._M_finish -
                               (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2) + 1;
          local_130._pt = (Clause *)malloc((long)iVar9 * 4 + 8);
          *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar9 * 0x100 + 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
          aVar21 = local_130;
          if ((long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar13 = (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            uVar14 = 1;
            do {
              if (*(uint *)local_130._pt >> 8 <= uVar14) goto LAB_001a68e7;
              (local_130._pt)->data[uVar14].x =
                   local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar14 - 1].x;
              lVar16 = (-(ulong)(lVar13 == 0) - lVar13) + uVar14;
              uVar14 = uVar14 + 1;
            } while (lVar16 != 0);
          }
          if (local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        else {
          aVar21._pt = (Clause *)0x0;
        }
        pIVar6 = (this->y).var;
        iVar10 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xe])
                           (pIVar6,(long)iVar10,aVar21._pt,1);
        if ((char)iVar10 != '\0') goto LAB_001a651f;
LAB_001a68e0:
        bVar24 = 0;
      }
      else {
LAB_001a651f:
        pIVar6 = (this->y).var;
        iVar10 = (pIVar6->min).v;
        if ((pIVar18->var->min).v < iVar10) {
          if (so.lazy == true) {
            uVar17 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                         uVar17 * 2);
            iVar9 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[8])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar9,local_128.
                                               super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_);
            iVar9 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar9);
            __l_04._M_len = 3;
            __l_04._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector(&local_60,__l_04,&local_131);
            iVar9 = (int)((ulong)((long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
            local_130._pt = (Clause *)malloc((long)iVar9 * 4 + 8);
            *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar9 * 0x100 + 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
            aVar21 = local_130;
            if ((long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_start != 0) {
              lVar13 = (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2;
              uVar14 = 1;
              do {
                if (*(uint *)local_130._pt >> 8 <= uVar14) goto LAB_001a68e7;
                (local_130._pt)->data[uVar14].x =
                     local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14 - 1].x;
                lVar16 = (-(ulong)(lVar13 == 0) - lVar13) + uVar14;
                uVar14 = uVar14 + 1;
              } while (lVar16 != 0);
            }
            if (local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            aVar21._pt = (Clause *)0x0;
          }
          iVar10 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[0xe])
                             (pIVar18->var,(long)iVar10,aVar21._pt,1);
          if ((char)iVar10 == '\0') goto LAB_001a68e0;
        }
        iVar10 = (pIVar18->var->max).v;
        if (iVar10 < (((this->y).var)->max).v) {
          if (so.lazy == true) {
            uVar17 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                         uVar17 * 2);
            iVar9 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[9])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar9,local_128.
                                               super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_);
            iVar9 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar9);
            __l_05._M_len = 3;
            __l_05._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      (&local_78,__l_05,(allocator_type *)&local_130);
            pCVar12 = Reason_new(&local_78);
            if (local_78.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            pCVar12 = (Clause *)0x0;
          }
          pIVar6 = (this->y).var;
          iVar10 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xf])
                             (pIVar6,(long)iVar10,pCVar12,1);
          if ((char)iVar10 == '\0') goto LAB_001a68e0;
        }
        pIVar6 = (this->y).var;
        iVar10 = (pIVar6->max).v;
        if (iVar10 < (pIVar18->var->max).v) {
          if (so.lazy == true) {
            uVar17 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                         uVar17 * 2);
            iVar9 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar9,local_128.
                                               super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_);
            iVar9 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar9);
            __l_06._M_len = 3;
            __l_06._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      (&local_90,__l_06,(allocator_type *)&local_130);
            pCVar12 = Reason_new(&local_90);
            if (local_90.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_90.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            pCVar12 = (Clause *)0x0;
          }
          iVar10 = (*(pIVar18->var->super_Var).super_Branching._vptr_Branching[0xf])
                             (pIVar18->var,(long)iVar10,pCVar12,1);
          if ((char)iVar10 == '\0') goto LAB_001a68e0;
        }
        pIVar6 = (this->y).var;
        bVar24 = 1;
        if (((pIVar6->min).v == (pIVar6->max).v) && ((pIVar18->var->min).v == (pIVar18->var->max).v)
           ) {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&(this->super_Propagator).satisfied;
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(1,(int)(this->super_Propagator).satisfied.v);
          vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
          (this->super_Propagator).satisfied.v = '\x01';
        }
      }
      goto LAB_001a66cf;
    }
LAB_001a5957:
    if (cVar2 == '\0') {
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (Lit *)0x0;
      bVar20 = false;
      bVar23 = false;
      uVar14 = 0;
      do {
        pIVar6 = (this->x).var;
        if ((((long)uVar14 < (long)(pIVar6->min).v) || ((long)(pIVar6->max).v < (long)uVar14)) ||
           ((pIVar6->vals != (Tchar *)0x0 && (pIVar6->vals[uVar14].v == '\0')))) {
          iVar10 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xd])(pIVar6,uVar14,1);
          local_130._a._0_4_ = iVar10;
          if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) goto LAB_001a5e5f;
          std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                    (&local_128,
                     (iterator)
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish,(Lit *)&local_130);
        }
        else {
          pIVar6 = (this->y).var;
          pIVar7 = (this->a).data[uVar14].var;
          if ((pIVar6->max).v < (pIVar7->min).v) {
            if (!bVar23) {
              iVar10 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])();
              local_130._a._0_4_ = iVar10;
              if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                          (&local_128,
                           (iterator)
                           local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Lit *)&local_130);
              }
              else {
                (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_finish)->x = iVar10;
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              bVar23 = true;
            }
            iVar10 = (*(((this->a).data[uVar14].var)->super_Var).super_Branching._vptr_Branching[8])
                               ();
            local_130._a._0_4_ = iVar10;
            if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                        (&local_128,
                         (iterator)
                         local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_finish,(Lit *)&local_130);
            }
            else {
LAB_001a5e5f:
              (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = iVar10;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
            if ((pIVar6->min).v <= (pIVar7->max).v) break;
            if (!bVar20) {
              iVar10 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[8])();
              local_130._a._0_4_ = iVar10;
              if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                          (&local_128,
                           (iterator)
                           local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Lit *)&local_130);
              }
              else {
                (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_finish)->x = iVar10;
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              bVar20 = true;
            }
            iVar10 = (*(((this->a).data[uVar14].var)->super_Var).super_Branching._vptr_Branching[9])
                               ();
            local_130._a._0_4_ = iVar10;
            if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_001a5e5f;
            std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                      (&local_128,
                       (iterator)
                       local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_finish,(Lit *)&local_130);
          }
        }
        uVar17 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar17;
      } while (uVar17 <= (this->a).sz);
      lVar13 = (long)(((this->x).var)->max).v;
      uVar15 = uVar14;
      if (lVar13 < (long)uVar14) {
        std::vector<Lit,_std::allocator<Lit>_>::vector(&local_108,&local_128);
        iVar10 = (int)((ulong)((long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2) + 1;
        local_130._pt = (Clause *)malloc((long)iVar10 * 4 + 8);
        *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar10 * 0x100 + 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
        aVar21 = local_130;
        if ((long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar16 = (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          uVar15 = 1;
          do {
            if (*(uint *)local_130._pt >> 8 <= uVar15) goto LAB_001a68e7;
            (local_130._pt)->data[uVar15].x =
                 local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15 - 1].x;
            lVar1 = (-(ulong)(lVar16 == 0) - lVar16) + uVar15;
            uVar15 = uVar15 + 1;
          } while (lVar1 != 0);
        }
        if (local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),(Reason)aVar21);
        uVar15 = (ulong)(sat.confl == (Clause *)0x0);
      }
      bVar24 = (byte)uVar15;
      if ((IntElemBoundsImp<0,_0,_0> *)
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start != (IntElemBoundsImp<0,_0,_0> *)0x0) {
        operator_delete(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar8 = bVar24;
      if (lVar13 < (long)uVar14) goto LAB_001a66cf;
    }
    else {
      bVar23 = (this->a).sz != 0;
      if (bVar23) {
        uVar14 = 0;
        do {
          pIVar6 = (this->x).var;
          if ((((long)(pIVar6->min).v <= (long)uVar14) && ((long)uVar14 <= (long)(pIVar6->max).v))
             && ((pIVar6->vals == (Tchar *)0x0 || (pIVar6->vals[uVar14].v != '\0')))) {
            pIVar18 = (this->a).data;
            if ((((this->y).var)->max).v < ((pIVar18[uVar14].var)->min).v) {
              uVar17 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                     uVar17 * 2);
              iVar10 = (*((pIVar18[uVar14].var)->super_Var).super_Branching._vptr_Branching[8])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar10,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar10 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar10);
              __l_00._M_len = 3;
              __l_00._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector(&local_d8,__l_00,&local_131);
              iVar10 = (int)((ulong)((long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
              local_130._pt = (Clause *)malloc((long)iVar10 * 4 + 8);
              *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar10 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
              aVar21 = local_130;
              if ((long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start != 0) {
                lVar13 = (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2;
                uVar15 = 1;
                do {
                  if (*(uint *)local_130._pt >> 8 <= uVar15) goto LAB_001a68e7;
                  (local_130._pt)->data[uVar15].x =
                       local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15 - 1].x;
                  lVar16 = (-(ulong)(lVar13 == 0) - lVar13) + uVar15;
                  uVar15 = uVar15 + 1;
                } while (lVar16 != 0);
              }
              if (local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pIVar6 = (this->x).var;
              if ((((long)uVar14 < (long)(pIVar6->min).v) || ((long)(pIVar6->max).v < (long)uVar14))
                 || ((pIVar6->vals != (Tchar *)0x0 && (pIVar6->vals[uVar14].v == '\0'))))
              goto LAB_001a5b2c;
              if (so.lazy == false) {
                aVar21._pt = (Clause *)0x0;
              }
              iVar10 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0x11])
                                 (pIVar6,uVar14,aVar21._pt,1);
              if ((char)iVar10 != '\0') goto LAB_001a5b2c;
LAB_001a66e7:
              bVar24 = 0;
              bVar8 = 0;
              if (bVar23) goto LAB_001a66cf;
              goto LAB_001a5f9f;
            }
LAB_001a5b2c:
            pIVar18 = (this->a).data;
            if (((pIVar18[uVar14].var)->max).v < (((this->y).var)->min).v) {
              uVar17 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) +
                                     uVar17 * 2);
              iVar10 = (*((pIVar18[uVar14].var)->super_Var).super_Branching._vptr_Branching[9])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar10,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar10 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar10);
              __l_01._M_len = 3;
              __l_01._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector(&local_f0,__l_01,&local_131);
              iVar10 = (int)((ulong)((long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
              local_130._pt = (Clause *)malloc((long)iVar10 * 4 + 8);
              *(uint *)local_130._pt = (*(uint *)local_130._pt & 0xfc) + iVar10 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
              aVar21 = local_130;
              if ((long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start != 0) {
                lVar13 = (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                               super__Vector_impl_data._M_start >> 2;
                uVar15 = 1;
                do {
                  if (*(uint *)local_130._pt >> 8 <= uVar15) goto LAB_001a68e7;
                  (local_130._pt)->data[uVar15].x =
                       local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar15 - 1].x;
                  lVar16 = (-(ulong)(lVar13 == 0) - lVar13) + uVar15;
                  uVar15 = uVar15 + 1;
                } while (lVar16 != 0);
              }
              if (local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pIVar6 = (this->x).var;
              if ((((long)(pIVar6->min).v <= (long)uVar14) &&
                  ((long)uVar14 <= (long)(pIVar6->max).v)) &&
                 ((pIVar6->vals == (Tchar *)0x0 || (pIVar6->vals[uVar14].v != '\0')))) {
                if (so.lazy == false) {
                  aVar21._pt = (Clause *)0x0;
                }
                iVar10 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0x11])
                                   (pIVar6,uVar14,aVar21._pt,1);
                if ((char)iVar10 == '\0') goto LAB_001a66e7;
              }
            }
          }
          uVar14 = uVar14 + 1;
          bVar23 = uVar14 < (this->a).sz;
        } while (bVar23);
      }
      bVar8 = 0;
    }
LAB_001a5f9f:
    bVar24 = bVar8;
    if (this->no_min_support == true) {
      local_130._a = 0x7fffffffffffffff;
      uVar14 = (ulong)(this->a).sz;
      if (uVar14 == 0) {
        iVar10 = -1;
      }
      else {
        aVar21._a = 0x7fffffffffffffff;
        pIVar6 = (this->x).var;
        pIVar18 = (this->a).data;
        uVar22 = 0xffffffff;
        uVar15 = 0;
        do {
          if ((((long)(pIVar6->min).v <= (long)uVar15) && ((long)uVar15 <= (long)(pIVar6->max).v))
             && ((pIVar6->vals == (Tchar *)0x0 || (pIVar6->vals[uVar15].v != '\0')))) {
            iVar9 = (pIVar18->var->min).v;
            aVar19 = (anon_union_8_2_743a5d44_for_Reason_0)(long)iVar9;
            bVar23 = (long)aVar19._pt < (long)aVar21._pt;
            if (bVar23) {
              uVar22 = uVar15 & 0xffffffff;
              aVar21 = aVar19;
              local_130 = aVar19;
            }
            iVar10 = (int)uVar22;
            if (bVar23 && iVar9 <= (((this->y).var)->min).v) break;
          }
          iVar10 = (int)uVar22;
          uVar15 = uVar15 + 1;
          pIVar18 = pIVar18 + 1;
        } while (uVar14 != uVar15);
      }
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&this->min_support;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(4,(this->min_support).v);
      vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
      (this->min_support).v = iVar10;
      pIVar6 = (this->y).var;
      if ((long)(pIVar6->min).v < (long)local_130) {
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&local_130;
        if (sat.assigns.data[(uint)(this->b).v] == '\0') {
          bVar8 = 1;
          if ((long)(pIVar6->max).v < (long)local_130._pt) {
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)this;
            RVar11.field_0 =
                 (anon_union_8_2_743a5d44_for_Reason_0)
                 propagate::anon_class_16_2_f8370e7b::operator()
                           ((anon_class_16_2_f8370e7b *)&local_128);
            iVar10 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
            if (*(uint *)RVar11.field_0 < 0x200) goto LAB_001a68e7;
            *(int *)((long)RVar11.field_0 + 8) = iVar10;
            SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),RVar11);
            bVar24 = sat.confl == (Clause *)0x0;
            bVar8 = 0;
          }
        }
        else {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)this;
          pCVar12 = propagate::anon_class_16_2_f8370e7b::operator()
                              ((anon_class_16_2_f8370e7b *)&local_128);
          if (*(uint *)pCVar12 < 0x200) goto LAB_001a68e7;
          uVar17 = (this->b).v;
          *(uint *)(pCVar12 + 1) =
               (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
          pIVar6 = (this->y).var;
          iVar10 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xe])
                             (pIVar6,local_130._pt,pCVar12,1);
          bVar8 = (byte)iVar10;
          bVar24 = bVar24 & bVar8;
        }
        if (bVar8 != 0) goto LAB_001a6394;
        bVar23 = false;
      }
      else {
LAB_001a6394:
        this->no_min_support = false;
        bVar23 = true;
      }
      if (!bVar23) goto LAB_001a66cf;
    }
    if (this->no_max_support == true) {
      uVar14 = (ulong)(this->a).sz;
      if (uVar14 == 0) {
        iVar10 = -1;
        local_130._a = 0xffffffff80000000;
      }
      else {
        pIVar6 = (this->x).var;
        pIVar18 = (this->a).data;
        uVar22 = 0xffffffff;
        uVar15 = 0;
        aVar21._a = 0xffffffff80000000;
        do {
          local_130 = aVar21;
          if ((((long)(pIVar6->min).v <= (long)uVar15) && ((long)uVar15 <= (long)(pIVar6->max).v))
             && ((pIVar6->vals == (Tchar *)0x0 || (pIVar6->vals[uVar15].v != '\0')))) {
            iVar9 = (pIVar18->var->max).v;
            aVar19 = (anon_union_8_2_743a5d44_for_Reason_0)(long)iVar9;
            if ((long)aVar21._pt <= (long)aVar19._pt) {
              local_130 = aVar19;
            }
            if ((long)aVar21._pt < (long)aVar19._pt) {
              uVar22 = uVar15 & 0xffffffff;
            }
            iVar10 = (int)uVar22;
            if (((long)aVar21._pt < (long)aVar19._pt) && ((((this->y).var)->max).v <= iVar9)) break;
          }
          iVar10 = (int)uVar22;
          uVar15 = uVar15 + 1;
          pIVar18 = pIVar18 + 1;
          aVar21 = local_130;
        } while (uVar14 != uVar15);
      }
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&this->max_support;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(4,(this->max_support).v);
      vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
      (this->max_support).v = iVar10;
      pIVar6 = (this->y).var;
      if ((long)local_130 < (long)(pIVar6->max).v) {
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&local_130;
        if (sat.assigns.data[(uint)(this->b).v] == '\0') {
          bVar8 = 1;
          if ((long)local_130._pt < (long)(pIVar6->min).v) {
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)this;
            RVar11.field_0 =
                 (anon_union_8_2_743a5d44_for_Reason_0)
                 propagate::anon_class_16_2_f8370e7b::operator()
                           ((anon_class_16_2_f8370e7b *)&local_128);
            iVar10 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
            if (*(uint *)RVar11.field_0 < 0x200) goto LAB_001a68e7;
            *(int *)((long)RVar11.field_0 + 8) = iVar10;
            SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),RVar11);
            bVar24 = sat.confl == (Clause *)0x0;
            bVar8 = 0;
          }
        }
        else {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)this;
          pCVar12 = propagate::anon_class_16_2_f8370e7b::operator()
                              ((anon_class_16_2_f8370e7b *)&local_128);
          if (*(uint *)pCVar12 < 0x200) {
LAB_001a68e7:
            abort();
          }
          uVar17 = (this->b).v;
          *(uint *)(pCVar12 + 1) =
               (uint)((int)sat.assigns.data[uVar17] - 1U < 0xfffffffd) + uVar17 * 2;
          pIVar6 = (this->y).var;
          iVar10 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xf])
                             (pIVar6,local_130._pt,pCVar12,1);
          bVar8 = (byte)iVar10;
          bVar24 = bVar24 & bVar8;
        }
        if (bVar8 != 0) goto LAB_001a66be;
        bVar23 = false;
      }
      else {
LAB_001a66be:
        this->no_max_support = false;
        bVar23 = true;
      }
      if (!bVar23) goto LAB_001a66cf;
    }
  }
  else {
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&(this->super_Propagator).satisfied;
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(1,(int)(this->super_Propagator).satisfied.v);
    vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
    (this->super_Propagator).satisfied.v = '\x01';
  }
  bVar24 = 1;
LAB_001a66cf:
  return (bool)(bVar24 & 1);
}

Assistant:

bool propagate() override {
		if (b.isFixed() && b.isFalse()) {
			satisfied = true;
			return true;
		}

		// x is out of bounds
		if ((is_fixed != 0) && (fixed_index < 0 || fixed_index >= static_cast<int>(a.size()))) {
			return b.setVal(false, x.getValLit());
		}

		// y = a[fixed_index]
		if (is_fixed != 0) {
			assert(x.getVal() == fixed_index);
			const IntView<W>& f = a[fixed_index];
			if (b.isFixed()) {
				setDom(y, setMin, f.getMin(), Reason_new({b.getValLit(), f.getMinLit(), x.getValLit()}));
				setDom(f, setMin, y.getMin(), Reason_new({b.getValLit(), y.getMinLit(), x.getValLit()}));
				setDom(y, setMax, f.getMax(), Reason_new({b.getValLit(), f.getMaxLit(), x.getValLit()}));
				setDom(f, setMax, y.getMax(), Reason_new({b.getValLit(), y.getMaxLit(), x.getValLit()}));
				if (y.isFixed() && f.isFixed()) {
					satisfied = true;
				}
			} else if (f.getMin() > y.getMax()) {
				Clause* r = Reason_new({x.getValLit(), f.getMinLit(), y.getMaxLit()});
				return b.setVal(false, r);
			} else if (f.getMax() < y.getMin()) {
				Clause* r = Reason_new({x.getValLit(), f.getMaxLit(), y.getMinLit()});
				return b.setVal(false, r);
			}
			return true;
		}

		if (b.isFixed()) {
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				if (y.getMax() < a[i].getMin()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMinLit(), y.getMaxLit()});
					setDom(x, remVal, i, r);
				}
				if (y.getMin() > a[i].getMax()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMaxLit(), y.getMinLit()});
					setDom(x, remVal, i, r);
				}
			}
		} else {
			std::vector<Lit> expl;
			bool push_min = false;
			bool push_max = false;
			unsigned int i = 0;
			while (i <= a.size()) {
				if (!x.indomain(i)) {
					expl.push_back(x.getLit(i, LR_EQ));
				} else if (y.getMax() < a[i].getMin()) {
					if (!push_max) {
						expl.push_back(y.getMaxLit());
						push_max = true;
					}
					expl.push_back(a[i].getMinLit());
				} else if (y.getMin() > a[i].getMax()) {
					if (!push_min) {
						expl.push_back(y.getMinLit());
						push_min = true;
					}
					expl.push_back(a[i].getMaxLit());
				} else {
					break;
				}
				i++;
			}
			if (i > x.getMax()) {
				Clause* r = Reason_new(expl);
				return b.setVal(false, r);
			}
		}

		if (no_min_support) {
			const int64_t old_m = y.getMin();
			int64_t new_m = INT64_MAX;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMin();
				if (cur_m < new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m <= old_m) {
						break;
					}
				}
			}
			min_support = best;
			if (y.setMinNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse lower bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMinLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMin(new_m, r)) {
						return false;
					}
				} else if (y.getMax() < new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMaxLit();
					return b.setVal(false, r);
				}
			}
			no_min_support = false;
		}

		if (no_max_support) {
			const int64_t old_m = y.getMax();
			int64_t new_m = INT_MIN;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMax();
				if (cur_m > new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m >= old_m) {
						break;
					}
				}
			}
			max_support = best;
			if (y.setMaxNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse upper bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMaxLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMax(new_m, r)) {
						return false;
					}
				} else if (y.getMin() > new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMinLit();
					return b.setVal(false, r);
				}
			}
			no_max_support = false;
		}

		return true;
	}